

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-c.cpp
# Opt level: O2

bool __thiscall
duckdb::FromCBlobCastWrapper::Operation<duckdb_blob,duckdb_string>
          (FromCBlobCastWrapper *this,duckdb_blob input,duckdb_string *result)

{
  bool bVar1;
  uint uVar2;
  string_t input_00;
  undefined4 uStack_1c;
  undefined4 uStack_18;
  undefined4 local_14;
  
  uVar2 = (uint)input.data;
  if (uVar2 < 0xd) {
    local_14 = 0;
    uStack_1c = 0;
    uStack_18 = 0;
    if (uVar2 == 0) {
      this = (FromCBlobCastWrapper *)0x0;
    }
    else {
      switchD_00916250::default(&uStack_1c,this,(ulong)(uVar2 & 0xf));
      this = (FromCBlobCastWrapper *)CONCAT44(local_14,uStack_18);
    }
  }
  else {
    uStack_1c = *(undefined4 *)this;
  }
  input_00.value._4_1_ = (undefined1)uStack_1c;
  input_00.value._5_1_ = uStack_1c._1_1_;
  input_00.value._6_1_ = uStack_1c._2_1_;
  input_00.value._7_1_ = uStack_1c._3_1_;
  input_00.value.pointer.length = uVar2;
  input_00.value.pointer.ptr = (char *)this;
  bVar1 = ToCStringCastWrapper<duckdb::CastFromBlob>::Operation<duckdb::string_t,duckdb_string>
                    (input_00,(duckdb_string *)input.size);
  return bVar1;
}

Assistant:

bool FromCBlobCastWrapper::Operation(duckdb_blob input, duckdb_string &result) {
	string_t input_str(const_char_ptr_cast(input.data), UnsafeNumericCast<uint32_t>(input.size));
	return ToCStringCastWrapper<duckdb::CastFromBlob>::template Operation<string_t, duckdb_string>(input_str, result);
}